

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall testing::Matcher<long>::Matcher(Matcher<long> *this,long value)

{
  MatcherBase<long> local_28;
  
  (this->super_MatcherBase<long>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<long>).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001bdbb8;
  local_28.vtable_ =
       (VTable *)
       internal::MatcherBase<long>::
       GetVTable<testing::internal::MatcherBase<long>::ValuePolicy<testing::internal::EqMatcher<long>,true>>()
       ::kVTable;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001bdbb8;
  local_28.buffer_ = (Buffer)value;
  internal::MatcherBase<long>::operator=(&this->super_MatcherBase<long>,&local_28);
  internal::MatcherBase<long>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }